

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::OutputFile::updatePreviewImage(OutputFile *this,PreviewRgba *newPixels)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  LogicExc *this_00;
  TypedAttribute<Imf_2_5::PreviewImage> *this_01;
  PreviewImage *this_02;
  PreviewRgba *pPVar6;
  undefined8 uVar7;
  long in_RSI;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  Int64 savedPosition;
  int i;
  int numPixels;
  PreviewRgba *pixels;
  PreviewImage *pi;
  PreviewImageAttribute *pia;
  stringstream _iex_throw_s;
  Lock lock;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  Mutex *in_stack_fffffffffffffc28;
  Lock *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  Header *in_stack_fffffffffffffc40;
  int local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [408];
  long local_10;
  
  local_10 = in_RSI;
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,(bool)in_stack_fffffffffffffc27);
  if (*(long *)(*(long *)(in_RDI + 8) + 0x40) == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar4 = std::operator<<(local_1a8,"Cannot update preview image pixels. File \"");
    pcVar5 = fileName((OutputFile *)0x870712);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\" does not contain a preview image.");
    this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::LogicExc::LogicExc(this_00,local_1b8);
    __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
  }
  this_01 = Header::typedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::PreviewImage>>
                      (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  this_02 = TypedAttribute<Imf_2_5::PreviewImage>::value(this_01);
  pPVar6 = PreviewImage::pixels(this_02);
  uVar2 = PreviewImage::width(this_02);
  uVar3 = PreviewImage::height(this_02);
  for (local_1d8 = 0; local_1d8 < (int)(uVar2 * uVar3); local_1d8 = local_1d8 + 1) {
    pPVar6[local_1d8] = *(PreviewRgba *)(local_10 + (long)local_1d8 * 4);
  }
  uVar7 = (**(code **)(**(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x28) + 0x18))();
  plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x28);
  (**(code **)(*plVar1 + 0x20))(plVar1,*(undefined8 *)(*(long *)(in_RDI + 8) + 0x40));
  (*(this_01->super_Attribute)._vptr_Attribute[4])
            (this_01,*(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x28),
             (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x3c));
  plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x28);
  (**(code **)(*plVar1 + 0x20))(plVar1,uVar7);
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  return;
}

Assistant:

void
OutputFile::updatePreviewImage (const PreviewRgba newPixels[])
{
    Lock lock (*_data->_streamData);

    if (_data->previewPosition <= 0)
	THROW (IEX_NAMESPACE::LogicExc, "Cannot update preview image pixels. "
			      "File \"" << fileName() << "\" does not "
			      "contain a preview image.");

    //
    // Store the new pixels in the header's preview image attribute.
    //

    PreviewImageAttribute &pia =
	_data->header.typedAttribute <PreviewImageAttribute> ("preview");

    PreviewImage &pi = pia.value();
    PreviewRgba *pixels = pi.pixels();
    int numPixels = pi.width() * pi.height();

    for (int i = 0; i < numPixels; ++i)
	pixels[i] = newPixels[i];

    //
    // Save the current file position, jump to the position in
    // the file where the preview image starts, store the new
    // preview image, and jump back to the saved file position.
    //

    Int64 savedPosition = _data->_streamData->os->tellp();

    try
    {
        _data->_streamData->os->seekp (_data->previewPosition);
	pia.writeValueTo (*_data->_streamData->os, _data->version);
	_data->_streamData->os->seekp (savedPosition);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Cannot update preview image pixels for "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}